

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

string * __thiscall
settings::search_sqconfig_abi_cxx11_
          (string *__return_storage_ptr__,settings *this,char *initial_file_name)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string bckDir;
  string dir;
  pointer local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  char *local_98 [2];
  char local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  if (this == (settings *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    if ((search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_),
       iVar1 != 0)) {
      search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_._M_dataplus._M_p =
           (pointer)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,"?","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
    }
    if ((search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::
                                     cachedFileName_abi_cxx11_), iVar1 != 0)) {
      search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_._M_dataplus._M_p =
           (pointer)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,"?",
                 "");
      __cxa_atexit(std::__cxx11::string::~string,
                   &search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
    }
    pcVar2 = strrchr((char *)this,0x5c);
    pcVar3 = strrchr((char *)this,0x2f);
    if (pcVar3 < pcVar2) {
      pcVar3 = pcVar2;
    }
    if (pcVar3 == (char *)0x0) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    }
    else {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this,pcVar3 + 1);
    }
    if ((local_48 == search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_._M_string_length)
       && ((local_48 == 0 ||
           (iVar1 = bcmp(local_50,search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_.
                                  _M_dataplus._M_p,local_48), iVar1 == 0)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_._M_dataplus._M_p
                 ,search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_._M_dataplus.
                  _M_p + search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_.
                         _M_string_length);
    }
    else {
      local_b8 = &local_a8;
      local_b0 = 0;
      local_a8 = '\0';
      local_78 = local_68;
      local_58 = __return_storage_ptr__;
      std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_50 + local_48);
      iVar1 = 0x10;
      do {
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>((string *)local_98,local_78,local_78 + local_70);
        std::__cxx11::string::append((char *)local_98);
        __stream = fopen(local_98[0],"rt");
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>((string *)local_98,local_78,local_78 + local_70)
          ;
          std::__cxx11::string::append((char *)local_98);
          std::__cxx11::string::operator=((string *)&local_b8,(string *)local_98);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0]);
          }
          break;
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>((string *)local_98,local_78,local_78 + local_70);
        std::__cxx11::string::append((char *)local_98);
        std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      __return_storage_ptr__ = local_58;
      if (local_b0 == 0) {
        (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
        __return_storage_ptr__ = local_58;
        std::__cxx11::string::_M_assign
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (local_b8 == &local_a8) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_a0;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_b8;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
        }
        __return_storage_ptr__->_M_string_length = local_b0;
        local_b0 = 0;
        local_a8 = '\0';
        local_b8 = &local_a8;
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string search_sqconfig(const char * initial_file_name)
  {
    if (!initial_file_name)
      return string("");

    static string cachedDir = "?";
    static string cachedFileName = "?";
    const char * slash1 = strrchr(initial_file_name, '\\');
    const char * slash2 = strrchr(initial_file_name, '/');
    const char * slash = slash1 > slash2 ? slash1 : slash2;
    string dir = slash ? string(initial_file_name, slash - initial_file_name + 1) : string("");
    if (dir == cachedDir)
      return cachedFileName;

    string fileName;
    string bckDir = dir;
    for (int i = 0; i < 16; i++)
    {
      if (FILE * f = fopen((bckDir + ".sqconfig").c_str(), "rt"))
      {
        fclose(f);
        fileName = bckDir + ".sqconfig";
        break;
      }
      bckDir = bckDir + "../";
    }

    if (fileName.empty())
      return string("");

    cachedDir = dir;
    cachedFileName = fileName;
    return fileName;
  }